

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O3

string * tinyusdz::detail::to_xml_string<tinyusdz::value::color3f>
                   (string *__return_storage_ptr__,color3f *val)

{
  size_type *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  string local_88;
  string local_68;
  string local_48;
  
  dtos_abi_cxx11_(&local_48,(double)val->r);
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_48);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_b8 = *puVar4;
    lStack_b0 = plVar2[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar4;
    local_c8 = (ulong *)*plVar2;
  }
  local_c0 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  dtos_abi_cxx11_(&local_68,(double)val->g);
  uVar5 = 0xf;
  if (local_c8 != &local_b8) {
    uVar5 = local_b8;
  }
  if (uVar5 < local_68._M_string_length + local_c0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar6 = local_68.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_68._M_string_length + local_c0) goto LAB_002cd316;
    puVar3 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_002cd316:
    puVar3 = (undefined8 *)
             ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_68._M_dataplus._M_p);
  }
  local_e8 = &local_d8;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_d8 = *plVar2;
    uStack_d0 = puVar3[3];
  }
  else {
    local_d8 = *plVar2;
    local_e8 = (long *)*puVar3;
  }
  local_e0 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_e8);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_98 = *puVar4;
    lStack_90 = plVar2[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar4;
    local_a8 = (ulong *)*plVar2;
  }
  local_a0 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  dtos_abi_cxx11_(&local_88,(double)val->b);
  uVar5 = 0xf;
  if (local_a8 != &local_98) {
    uVar5 = local_98;
  }
  if (uVar5 < local_88._M_string_length + local_a0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar6 = local_88.field_2._M_allocated_capacity;
    }
    if (local_88._M_string_length + local_a0 <= (ulong)uVar6) {
      puVar3 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8);
      goto LAB_002cd442;
    }
  }
  puVar3 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
LAB_002cd442:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar6 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_xml_string(const value::color3f &val) {
  return dtos(double(val.r)) + ", " + dtos(double(val.g)) + ", " +
         dtos(double(val.b));
}